

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O2

void __thiscall
FIX::SocketAcceptor::onDisconnect(SocketAcceptor *this,SocketServer *param_1,socket_handle s)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  key_type local_14;
  
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
          ::find(&(this->m_connections)._M_t,&local_14);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->m_connections)._M_t._M_impl.super__Rb_tree_header)
  {
    p_Var1 = iVar2._M_node[1]._M_parent;
    if ((Session *)p_Var1[0x105]._M_right != (Session *)0x0) {
      Session::disconnect((Session *)p_Var1[0x105]._M_right);
    }
    (**(code **)(*(long *)p_Var1 + 8))(p_Var1);
    std::
    _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
    ::erase(&(this->m_connections)._M_t,&local_14);
  }
  return;
}

Assistant:

void SocketAcceptor::onDisconnect( SocketServer&, socket_handle s )
{
  SocketConnections::iterator i = m_connections.find( s );
  if ( i == m_connections.end() ) return ;
  SocketConnection* pSocketConnection = i->second;

  Session* pSession = pSocketConnection->getSession();
  if ( pSession ) pSession->disconnect();

  delete pSocketConnection;
  m_connections.erase( s );
}